

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classification.hpp
# Opt level: O0

bool __thiscall
boost::algorithm::detail::is_any_ofF<char>::operator()(is_any_ofF<char> *this,char Ch)

{
  bool bVar1;
  long in_RDI;
  char *unaff_retaddr;
  char *in_stack_00000008;
  set_value_type *Storage;
  
  use_fixed_storage(*(size_t *)(in_RDI + 0x10));
  bVar1 = std::binary_search<char_const*,char>(Storage,in_stack_00000008,unaff_retaddr);
  return bVar1;
}

Assistant:

bool operator()( Char2T Ch ) const
                {
                    const set_value_type* Storage=
                        (use_fixed_storage(m_Size))
                        ? &m_Storage.m_fixSet[0]
                        : m_Storage.m_dynSet;

                    return ::std::binary_search(Storage, Storage+m_Size, Ch);
                }